

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O3

void __thiscall InlineeFrameRecord::Dump(InlineeFrameRecord *this)

{
  FunctionBody *pFVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  char16 *pcVar6;
  FunctionInfo *pFVar7;
  ulong uVar8;
  
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  do {
    pcVar6 = Js::ParseableFunctionInfo::GetExternalDisplayName
                       (&this->functionBody->super_ParseableFunctionInfo);
    uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->functionBody);
    pFVar1 = this->functionBody;
    pFVar7 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar7 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      pFVar7 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    Output::Print(L"%s [#%u.%u] args:",pcVar6,(ulong)uVar4,(ulong)pFVar7->functionId);
    if (this->argCount != 0) {
      uVar8 = 0;
      do {
        DumpOffset(this,this->argOffsets[uVar8]);
        BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar8);
        pcVar6 = L"f ";
        if (((this->floatArgs).word >> (uVar8 & 0x3f) & 1) == 0) {
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar8);
          pcVar6 = L"i ";
          if (((this->losslessInt32Args).word & 1L << ((byte)uVar8 & 0x3f)) != 0) goto LAB_0055b0d4;
        }
        else {
LAB_0055b0d4:
          Output::Print(pcVar6);
        }
        Output::Print(L", ");
        uVar8 = uVar8 + 1;
      } while (uVar8 < this->argCount);
    }
    InlineeFrameInfo::Dump(this->frameInfo);
    Output::Print(L"func: ");
    DumpOffset(this,this->functionOffset);
    this = this->parent;
    if (this == (InlineeFrameRecord *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void InlineeFrameRecord::Dump() const
{
    Output::Print(_u("%s [#%u.%u] args:"), this->functionBody->GetExternalDisplayName(), this->functionBody->GetSourceContextId(), this->functionBody->GetLocalFunctionId());
    for (uint i = 0; i < argCount; i++)
    {
        DumpOffset(argOffsets[i]);
        if (floatArgs.Test(i))
        {
            Output::Print(_u("f "));
        }
        else if (losslessInt32Args.Test(i))
        {
            Output::Print(_u("i "));
        }
        Output::Print(_u(", "));
    }
    this->frameInfo->Dump();

    Output::Print(_u("func: "));
    DumpOffset(functionOffset);

    if (this->parent)
    {
        parent->Dump();
    }
}